

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QByteArray *
QtStringBuilder::
appendToByteArray<QStringBuilder<QStringBuilder<QByteArrayView,char_const(&)[3]>,QByteArrayView>,char_const(&)[3]>
          (QByteArray *a,
          QStringBuilder<QStringBuilder<QStringBuilder<QByteArrayView,_const_char_(&)[3]>,_QByteArrayView>,_const_char_(&)[3]>
          *b,char param_3)

{
  ArrayOptions *pAVar1;
  size_t sVar2;
  char (*pacVar3) [3];
  long lVar4;
  Data *pDVar5;
  char *pcVar6;
  char cVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  char *pcVar11;
  qsizetype n;
  long lVar12;
  
  pDVar5 = (a->d).d;
  lVar9 = (a->d).size;
  lVar12 = (b->a).b.m_size + (b->a).a.a.m_size + lVar9 + 4;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)a,(AllocationOption)lVar9);
    pDVar5 = (a->d).d;
    if (pDVar5 != (Data *)0x0) goto LAB_001fd432;
    if (0 < lVar12) {
      lVar9 = (a->d).size;
      goto LAB_001fd481;
    }
  }
  else {
LAB_001fd432:
    lVar8 = (pDVar5->super_QArrayData).alloc;
    pcVar11 = (a->d).ptr;
    lVar9 = (a->d).size;
    lVar10 = ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) + lVar8;
    if ((lVar10 - lVar9) - (long)pcVar11 < lVar12) {
      lVar4 = lVar8 * 2;
      if (lVar8 * 2 < lVar12) {
        lVar4 = lVar12;
      }
      lVar12 = lVar4;
      if ((1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar10 - (long)pcVar11 < lVar12)) {
LAB_001fd481:
        if (lVar12 < lVar9) {
          lVar12 = lVar9;
        }
        QByteArray::reallocData((longlong)a,(AllocationOption)lVar12);
        pDVar5 = (a->d).d;
        if (pDVar5 == (Data *)0x0) goto LAB_001fd4b1;
        lVar8 = (pDVar5->super_QArrayData).alloc;
      }
      if (lVar8 != 0) {
        pAVar1 = &(pDVar5->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
    }
    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_001fd4c2;
  }
LAB_001fd4b1:
  QByteArray::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_001fd4c2:
  pcVar11 = (a->d).ptr + (a->d).size;
  sVar2 = (b->a).a.a.m_size;
  if (sVar2 != 0) {
    memcpy(pcVar11,(b->a).a.a.m_data,sVar2);
  }
  pcVar11 = pcVar11 + sVar2;
  pcVar6 = *(b->a).a.b;
  cVar7 = *pcVar6;
  while (cVar7 != '\0') {
    pcVar6 = pcVar6 + 1;
    *pcVar11 = cVar7;
    pcVar11 = pcVar11 + 1;
    cVar7 = *pcVar6;
  }
  sVar2 = (b->a).b.m_size;
  if (sVar2 != 0) {
    memcpy(pcVar11,(b->a).b.m_data,sVar2);
  }
  pacVar3 = b->b;
  cVar7 = (*pacVar3)[0];
  if (cVar7 != '\0') {
    lVar9 = 0;
    do {
      pcVar11[lVar9 + sVar2] = cVar7;
      cVar7 = (*pacVar3)[lVar9 + 1];
      lVar9 = lVar9 + 1;
    } while (cVar7 != '\0');
  }
  QByteArray::resize((longlong)a);
  return a;
}

Assistant:

QByteArray &appendToByteArray(QByteArray &a, const QStringBuilder<A, B> &b, char)
{
    // append 8-bit data to a byte array
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    char *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    a.resize(len); //we need to resize after the appendTo for the case str+=foo+str
    return a;
}